

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseAttValueInternal
                    (xmlParserCtxtPtr ctxt,int *attlen,int *alloc,int normalize,int isNamespace)

{
  int iVar1;
  uint len;
  xmlChar *pxVar2;
  xmlEntityPtr pent;
  bool bVar3;
  bool local_89;
  xmlEntityPtr ent;
  xmlChar *name;
  int val;
  int replaceEntities;
  int inSpace;
  int chunkSize;
  int flags;
  int quote;
  int l;
  int c;
  xmlChar *ret;
  xmlSBuf buf;
  uint maxLength;
  int isNamespace_local;
  int normalize_local;
  int *alloc_local;
  int *attlen_local;
  xmlParserCtxtPtr ctxt_local;
  
  buf.code = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    buf.code = 1000000000;
  }
  val = 1;
  bVar3 = ctxt->replaceEntities != 0;
  local_89 = bVar3 || isNamespace != 0;
  xmlSBufInit((xmlSBuf *)&ret,buf.code);
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  chunkSize = (int)*ctxt->input->cur;
  if ((chunkSize == 0x22) || (chunkSize == 0x27)) {
    if (*ctxt->input->cur == '\n') {
      ctxt->input->line = ctxt->input->line + 1;
      ctxt->input->col = 1;
    }
    else {
      ctxt->input->col = ctxt->input->col + 1;
    }
    ctxt->input->cur = ctxt->input->cur + 1;
    if (ctxt->inSubset == 0) {
      inSpace = 6;
    }
    else {
      inSpace = 4;
    }
    val = 1;
    replaceEntities = 0;
    while (ctxt->disableSAX < 2) {
      if (ctxt->input->end <= ctxt->input->cur) {
        xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue: \' expected\n");
        break;
      }
      if ((((long)ctxt->input->end - (long)ctxt->input->cur < 10) &&
          ((ctxt->input->flags & 0x40U) == 0)) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      quote = (int)*ctxt->input->cur;
      if ((uint)quote < 0x80) {
        if (quote == 0x26) {
          if (ctxt->input->cur[1] == '#') {
            if (0 < replaceEntities) {
              xmlSBufAddString((xmlSBuf *)&ret,ctxt->input->cur + -(long)replaceEntities,
                               replaceEntities);
              replaceEntities = 0;
            }
            iVar1 = xmlParseCharRef(ctxt);
            if (iVar1 == 0) break;
            if ((iVar1 != 0x26) || (local_89)) {
              if (iVar1 == 0x20) {
                if ((normalize == 0) || (val == 0)) {
                  xmlSBufAddCString((xmlSBuf *)&ret," ",1);
                }
                val = 1;
              }
              else {
                xmlSBufAddChar((xmlSBuf *)&ret,iVar1);
                val = 0;
              }
            }
            else {
              xmlSBufAddCString((xmlSBuf *)&ret,"&#38;",5);
              val = 0;
            }
          }
          else {
            if (0 < replaceEntities) {
              xmlSBufAddString((xmlSBuf *)&ret,ctxt->input->cur + -(long)replaceEntities,
                               replaceEntities);
              replaceEntities = 0;
            }
            pxVar2 = xmlParseEntityRefInternal(ctxt);
            if ((pxVar2 != (xmlChar *)0x0) &&
               (pent = xmlLookupGeneralEntity(ctxt,pxVar2,1), pent != (xmlEntityPtr)0x0)) {
              if (pent->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                if ((*pent->content != '&') || (local_89)) {
                  xmlSBufAddString((xmlSBuf *)&ret,pent->content,pent->length);
                }
                else {
                  xmlSBufAddCString((xmlSBuf *)&ret,"&#38;",5);
                }
                val = 0;
              }
              else if (bVar3 || isNamespace != 0) {
                xmlExpandEntityInAttValue
                          (ctxt,(xmlSBuf *)&ret,pent->content,pent,normalize,&val,ctxt->inputNr,1);
              }
              else {
                if ((pent->flags & inSpace) != inSpace) {
                  xmlCheckEntityInAttValue(ctxt,pent,ctxt->inputNr);
                }
                iVar1 = xmlParserEntityCheck(ctxt,pent->expandedSize);
                if (iVar1 != 0) {
                  *pent->content = '\0';
                  break;
                }
                xmlSBufAddCString((xmlSBuf *)&ret,"&",1);
                pxVar2 = pent->name;
                len = xmlStrlen(pent->name);
                xmlSBufAddString((xmlSBuf *)&ret,pxVar2,len);
                xmlSBufAddCString((xmlSBuf *)&ret,";",1);
                val = 0;
              }
            }
          }
        }
        else {
          if ((uint)quote < 0x21) {
            if ((((uint)quote < 9) || (10 < (uint)quote)) &&
               ((quote != 0xd && ((uint)quote < 0x20)))) {
              xmlFatalErrMsg(ctxt,XML_ERR_INVALID_CHAR,"invalid character in attribute value\n");
              if (0 < replaceEntities) {
                xmlSBufAddString((xmlSBuf *)&ret,ctxt->input->cur + -(long)replaceEntities,
                                 replaceEntities);
                replaceEntities = 0;
              }
              xmlSBufAddReplChar((xmlSBuf *)&ret);
              val = 0;
            }
            else {
              if ((normalize == 0) || (val == 0)) {
                if ((uint)quote < 0x20) {
                  if (0 < replaceEntities) {
                    xmlSBufAddString((xmlSBuf *)&ret,ctxt->input->cur + -(long)replaceEntities,
                                     replaceEntities);
                    replaceEntities = 0;
                  }
                  xmlSBufAddCString((xmlSBuf *)&ret," ",1);
                }
                else {
                  replaceEntities = replaceEntities + 1;
                }
              }
              else if (0 < replaceEntities) {
                xmlSBufAddString((xmlSBuf *)&ret,ctxt->input->cur + -(long)replaceEntities,
                                 replaceEntities);
                replaceEntities = 0;
              }
              val = 1;
              if ((quote == 0xd) && (ctxt->input->cur[1] == '\n')) {
                ctxt->input->cur = ctxt->input->cur + 1;
              }
            }
          }
          else {
            if (quote == chunkSize) {
              if ((ret == (xmlChar *)0x0) && (alloc != (int *)0x0)) {
                _l = ctxt->input->cur + -(long)replaceEntities;
                if (attlen != (int *)0x0) {
                  *attlen = replaceEntities;
                }
                if (((normalize != 0) && (val != 0)) && (0 < replaceEntities)) {
                  *attlen = *attlen + -1;
                }
                *alloc = 0;
                xmlSBufCleanup((xmlSBuf *)&ret,ctxt,"AttValue length too long");
              }
              else {
                if (0 < replaceEntities) {
                  xmlSBufAddString((xmlSBuf *)&ret,ctxt->input->cur + -(long)replaceEntities,
                                   replaceEntities);
                }
                if (((normalize != 0) && (val != 0)) && ((int)buf.mem != 0)) {
                  buf.mem._0_4_ = (int)buf.mem + -1;
                }
                _l = xmlSBufFinish((xmlSBuf *)&ret,attlen,ctxt,"AttValue length too long");
                if (_l != (xmlChar *)0x0) {
                  if (attlen != (int *)0x0) {
                    *attlen = (int)buf.mem;
                  }
                  if (alloc != (int *)0x0) {
                    *alloc = 1;
                  }
                }
              }
              if (*ctxt->input->cur == '\n') {
                ctxt->input->line = ctxt->input->line + 1;
                ctxt->input->col = 1;
              }
              else {
                ctxt->input->col = ctxt->input->col + 1;
              }
              ctxt->input->cur = ctxt->input->cur + 1;
              return _l;
            }
            if (quote == 0x3c) {
              xmlFatalErr(ctxt,XML_ERR_LT_IN_ATTRIBUTE,(char *)0x0);
            }
            replaceEntities = replaceEntities + 1;
            val = 0;
          }
          if (*ctxt->input->cur == '\n') {
            ctxt->input->line = ctxt->input->line + 1;
            ctxt->input->col = 1;
          }
          else {
            ctxt->input->col = ctxt->input->col + 1;
          }
          ctxt->input->cur = ctxt->input->cur + 1;
        }
      }
      else {
        flags = xmlUTF8MultibyteLen(ctxt,ctxt->input->cur,"invalid character in attribute value\n");
        if (flags == 0) {
          if (0 < replaceEntities) {
            xmlSBufAddString((xmlSBuf *)&ret,ctxt->input->cur + -(long)replaceEntities,
                             replaceEntities);
            replaceEntities = 0;
          }
          xmlSBufAddReplChar((xmlSBuf *)&ret);
          if (*ctxt->input->cur == '\n') {
            ctxt->input->line = ctxt->input->line + 1;
            ctxt->input->col = 1;
          }
          else {
            ctxt->input->col = ctxt->input->col + 1;
          }
          ctxt->input->cur = ctxt->input->cur + 1;
        }
        else {
          replaceEntities = flags + replaceEntities;
          if (*ctxt->input->cur == '\n') {
            ctxt->input->line = ctxt->input->line + 1;
            ctxt->input->col = 1;
          }
          else {
            ctxt->input->col = ctxt->input->col + 1;
          }
          ctxt->input->cur = ctxt->input->cur + flags;
        }
        val = 0;
      }
    }
    xmlSBufCleanup((xmlSBuf *)&ret,ctxt,"AttValue length too long");
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlParseAttValueInternal(xmlParserCtxtPtr ctxt, int *attlen, int *alloc,
                         int normalize, int isNamespace) {
    unsigned maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                         XML_MAX_HUGE_LENGTH :
                         XML_MAX_TEXT_LENGTH;
    xmlSBuf buf;
    xmlChar *ret;
    int c, l, quote, flags, chunkSize;
    int inSpace = 1;
    int replaceEntities;

    /* Always expand namespace URIs */
    replaceEntities = (ctxt->replaceEntities) || (isNamespace);

    xmlSBufInit(&buf, maxLength);

    GROW;

    quote = CUR;
    if ((quote != '"') && (quote != '\'')) {
	xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
	return(NULL);
    }
    NEXTL(1);

    if (ctxt->inSubset == 0)
        flags = XML_ENT_CHECKED | XML_ENT_VALIDATED;
    else
        flags = XML_ENT_VALIDATED;

    inSpace = 1;
    chunkSize = 0;

    while (1) {
        if (PARSER_STOPPED(ctxt))
            goto error;

        if (CUR_PTR >= ctxt->input->end) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue: ' expected\n");
            goto error;
        }

        /*
         * TODO: Check growth threshold
         */
        if (ctxt->input->end - CUR_PTR < 10)
            GROW;

        c = CUR;

        if (c >= 0x80) {
            l = xmlUTF8MultibyteLen(ctxt, CUR_PTR,
                    "invalid character in attribute value\n");
            if (l == 0) {
                if (chunkSize > 0) {
                    xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                    chunkSize = 0;
                }
                xmlSBufAddReplChar(&buf);
                NEXTL(1);
            } else {
                chunkSize += l;
                NEXTL(l);
            }

            inSpace = 0;
        } else if (c != '&') {
            if (c > 0x20) {
                if (c == quote)
                    break;

                if (c == '<')
                    xmlFatalErr(ctxt, XML_ERR_LT_IN_ATTRIBUTE, NULL);

                chunkSize += 1;
                inSpace = 0;
            } else if (!IS_BYTE_CHAR(c)) {
                xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                        "invalid character in attribute value\n");
                if (chunkSize > 0) {
                    xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                    chunkSize = 0;
                }
                xmlSBufAddReplChar(&buf);
                inSpace = 0;
            } else {
                /* Whitespace */
                if ((normalize) && (inSpace)) {
                    /* Skip char */
                    if (chunkSize > 0) {
                        xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                        chunkSize = 0;
                    }
                } else if (c < 0x20) {
                    /* Convert to space */
                    if (chunkSize > 0) {
                        xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                        chunkSize = 0;
                    }

                    xmlSBufAddCString(&buf, " ", 1);
                } else {
                    chunkSize += 1;
                }

                inSpace = 1;

                if ((c == 0xD) && (NXT(1) == 0xA))
                    CUR_PTR++;
            }

            NEXTL(1);
        } else if (NXT(1) == '#') {
            int val;

            if (chunkSize > 0) {
                xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                chunkSize = 0;
            }

            val = xmlParseCharRef(ctxt);
            if (val == 0)
                goto error;

            if ((val == '&') && (!replaceEntities)) {
                /*
                 * The reparsing will be done in xmlNodeParseContent()
                 * called from SAX2.c
                 */
                xmlSBufAddCString(&buf, "&#38;", 5);
                inSpace = 0;
            } else if (val == ' ') {
                if ((!normalize) || (!inSpace))
                    xmlSBufAddCString(&buf, " ", 1);
                inSpace = 1;
            } else {
                xmlSBufAddChar(&buf, val);
                inSpace = 0;
            }
        } else {
            const xmlChar *name;
            xmlEntityPtr ent;

            if (chunkSize > 0) {
                xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                chunkSize = 0;
            }

            name = xmlParseEntityRefInternal(ctxt);
            if (name == NULL) {
                /*
                 * Probably a literal '&' which wasn't escaped.
                 * TODO: Handle gracefully in recovery mode.
                 */
                continue;
            }

            ent = xmlLookupGeneralEntity(ctxt, name, /* isAttr */ 1);
            if (ent == NULL)
                continue;

            if (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                if ((ent->content[0] == '&') && (!replaceEntities))
                    xmlSBufAddCString(&buf, "&#38;", 5);
                else
                    xmlSBufAddString(&buf, ent->content, ent->length);
                inSpace = 0;
            } else if (replaceEntities) {
                xmlExpandEntityInAttValue(ctxt, &buf, ent->content, ent,
                                          normalize, &inSpace, ctxt->inputNr,
                                          /* check */ 1);
            } else {
                if ((ent->flags & flags) != flags)
                    xmlCheckEntityInAttValue(ctxt, ent, ctxt->inputNr);

                if (xmlParserEntityCheck(ctxt, ent->expandedSize)) {
                    ent->content[0] = 0;
                    goto error;
                }

                /*
                 * Just output the reference
                 */
                xmlSBufAddCString(&buf, "&", 1);
                xmlSBufAddString(&buf, ent->name, xmlStrlen(ent->name));
                xmlSBufAddCString(&buf, ";", 1);

                inSpace = 0;
            }
	}
    }

    if ((buf.mem == NULL) && (alloc != NULL)) {
        ret = (xmlChar *) CUR_PTR - chunkSize;

        if (attlen != NULL)
            *attlen = chunkSize;
        if ((normalize) && (inSpace) && (chunkSize > 0))
            *attlen -= 1;
        *alloc = 0;

        /* Report potential error */
        xmlSBufCleanup(&buf, ctxt, "AttValue length too long");
    } else {
        if (chunkSize > 0)
            xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);

        if ((normalize) && (inSpace) && (buf.size > 0))
            buf.size--;

        ret = xmlSBufFinish(&buf, attlen, ctxt, "AttValue length too long");

        if (ret != NULL) {
            if (attlen != NULL)
                *attlen = buf.size;
            if (alloc != NULL)
                *alloc = 1;
        }
    }

    NEXTL(1);

    return(ret);

error:
    xmlSBufCleanup(&buf, ctxt, "AttValue length too long");
    return(NULL);
}